

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_join.cpp
# Opt level: O2

void __thiscall
duckdb::PositionalJoinGlobalState::Execute
          (PositionalJoinGlobalState *this,DataChunk *input,DataChunk *output)

{
  idx_t count;
  idx_t col_offset;
  reference this_00;
  reference other;
  idx_t i;
  size_type __n;
  
  ::std::mutex::lock(&this->rhs_lock);
  col_offset = ((long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x68;
  for (__n = 0; col_offset != __n; __n = __n + 1) {
    this_00 = vector<duckdb::Vector,_true>::get<true>(&output->data,__n);
    other = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
    Vector::Reference(this_00,other);
  }
  count = input->count;
  InitializeScan(this);
  Refill(this);
  CopyData(this,output,count,col_offset);
  output->count = count;
  pthread_mutex_unlock((pthread_mutex_t *)&this->rhs_lock);
  return;
}

Assistant:

void PositionalJoinGlobalState::Execute(DataChunk &input, DataChunk &output) {
	lock_guard<mutex> client_guard(rhs_lock);

	// Reference the input and assume it will be full
	const auto col_offset = input.ColumnCount();
	for (idx_t i = 0; i < col_offset; ++i) {
		output.data[i].Reference(input.data[i]);
	}

	// Copy or reference the RHS columns
	const auto count = input.size();
	InitializeScan();
	Refill();
	CopyData(output, count, col_offset);

	output.SetCardinality(count);
}